

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

double __thiscall ON_OutlineFigure::AreaEstimate(ON_OutlineFigure *this)

{
  ON_OutlineFigurePoint *pOVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  uint uVar7;
  int cvdex;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int tdex;
  uint uVar11;
  long lVar12;
  double *pdVar13;
  ON_OutlineFigurePoint *pOVar14;
  int tdex_1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  ON_2dPoint OVar21;
  ON_OutlineFigurePoint p;
  ON_OutlineFigurePoint figure_start;
  ON_2dPoint cv [4];
  double quad [3] [3];
  double cubic [3] [4];
  ON_2dPoint local_1e8;
  undefined8 local_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  ON_OutlineFigurePoint local_1c8;
  ON__UINT32 local_1bc;
  undefined8 local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ON_OutlineFigurePoint *local_1a8;
  ON_OutlineFigure *local_1a0;
  ON_2dPoint local_198;
  ON_2dPoint local_188;
  ON_2dPoint local_178;
  ON_2dPoint local_168;
  undefined1 local_158 [8];
  float local_150;
  ON_2dPoint local_148;
  ON_2dPoint local_138;
  ON_2dPoint local_128;
  ON_2dPoint local_118;
  ON_2dPoint local_108;
  ON_2dPoint local_f8;
  double local_e8 [7];
  double adStack_b0 [16];
  
  if (this->m_area_status == '\0') {
    this->m_area_estimate = ON_DBL_QNAN;
    this->m_area_status = '\a';
    uVar7 = Internal_FigureEndDex(this,false);
    if (uVar7 != 0) {
      pOVar14 = (this->m_points).m_a;
      local_150 = (pOVar14->m_point).y;
      local_158[0] = pOVar14->m_point_type;
      local_158[1] = pOVar14->m_point_proximity;
      local_158._2_2_ = pOVar14->m_figure_index;
      local_158._4_4_ = (pOVar14->m_point).x;
      local_1a0 = this;
      if (((uVar7 < 3) || (local_158[0] == '\x02')) ||
         (pOVar14[uVar7].m_point_type == EndFigureOpen)) {
        this->m_area_estimate = 0.0;
        this->m_area_status = '\x01';
      }
      else {
        local_e8[0] = -1.23432101234321e+308;
        adStack_b0[3] = -1.23432101234321e+308;
        ON_2dPoint::operator=(&local_1e8,(ON_2fPoint *)(local_158 + 4));
        uVar9 = 1;
        dVar15 = 0.0;
        local_1bc = uVar7;
        local_1a8 = pOVar14;
        do {
          uStack_1cc = local_1e8.y._4_4_;
          uStack_1d0 = local_1e8.y._0_4_;
          uVar16 = 0;
          local_1d8 = (double)CONCAT44(local_1e8.x._4_4_,local_1e8.x._0_4_);
          uVar8 = (uint)uVar9;
          local_1c8.m_point.y = pOVar14[uVar9].m_point.y;
          pOVar1 = pOVar14 + uVar9;
          local_1c8.m_point_type = pOVar1->m_point_type;
          local_1c8.m_point_proximity = pOVar1->m_point_proximity;
          local_1c8.m_figure_index = pOVar1->m_figure_index;
          local_1c8.m_point.x = (pOVar1->m_point).x;
          ON_2dPoint::operator=(&local_1e8,&local_1c8.m_point);
          if (local_1c8.m_point_type == CubicBezierPoint) {
            bVar6 = ON_OutlineFigurePoint::IsOffFigure(&local_1c8);
            if ((!bVar6) || (uVar11 = uVar8 + 2, uVar7 <= uVar11)) break;
            if (local_1c8.m_point_type != pOVar14[uVar8 + 1].m_point_type) break;
            bVar6 = ON_OutlineFigurePoint::IsOffFigure(pOVar14 + (uVar8 + 1));
            if (!bVar6) break;
            if ((local_1c8.m_point_type != pOVar14[uVar11].m_point_type) ||
               (bVar6 = ON_OutlineFigurePoint::IsOnFigure(pOVar14 + uVar11), !bVar6)) break;
            if ((adStack_b0[3] == -1.23432101234321e+308) && (!NAN(adStack_b0[3]))) {
              lVar12 = 1;
              pdVar13 = adStack_b0 + 3;
              do {
                local_1b8 = (double)(int)lVar12 * 0.25;
                lVar10 = 0;
                do {
                  dVar2 = ON_EvaluateBernsteinBasis(3,(int)lVar10,local_1b8);
                  pdVar13[lVar10] = dVar2;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 4);
                lVar12 = lVar12 + 1;
                pdVar13 = pdVar13 + 4;
              } while (lVar12 != 4);
            }
            local_148.y = (double)CONCAT44(uStack_1cc,uStack_1d0);
            local_148.x = local_1d8;
            local_138.x = (double)CONCAT44(local_1e8.x._4_4_,local_1e8.x._0_4_);
            local_138.y = (double)CONCAT44(local_1e8.y._4_4_,local_1e8.y._0_4_);
            ON_2dPoint::operator=(&local_128,&pOVar14[uVar8 + 1].m_point);
            ON_2dPoint::operator=(&local_118,&local_1a8[uVar11].m_point);
            local_1e8.x._0_4_ = (undefined4)local_1d8;
            local_1e8.x._4_4_ = local_1d8._4_4_;
            local_1e8.y._0_4_ = uStack_1d0;
            local_1e8.y._4_4_ = uStack_1cc;
            lVar12 = 0x18;
            uVar17 = uStack_1d0;
            uVar18 = uStack_1cc;
            uVar19 = uStack_1d0;
            uVar20 = uStack_1cc;
            do {
              local_1d8 = (double)CONCAT44(local_1e8.x._4_4_,local_1e8.x._0_4_);
              local_1b8 = (double)CONCAT44(local_1e8.y._4_4_,local_1e8.y._0_4_);
              uStack_1d0 = uVar17;
              uStack_1cc = uVar18;
              uStack_1b0 = uVar19;
              uStack_1ac = uVar20;
              OVar21 = ::operator*(*(double *)((long)adStack_b0 + lVar12),&local_148);
              local_188.y = OVar21.y;
              local_188.x = OVar21.x;
              OVar21 = ::operator*(*(double *)((long)adStack_b0 + lVar12 + 8),&local_138);
              local_198.y = OVar21.y;
              local_198.x = OVar21.x;
              OVar21 = ON_2dPoint::operator+(&local_188,&local_198);
              local_178.y = OVar21.y;
              local_178.x = OVar21.x;
              OVar21 = ::operator*(*(double *)((long)adStack_b0 + lVar12 + 0x10),&local_128);
              local_f8.y = OVar21.y;
              local_f8.x = OVar21.x;
              OVar21 = ON_2dPoint::operator+(&local_178,&local_f8);
              local_168.y = OVar21.y;
              local_168.x = OVar21.x;
              OVar21 = ::operator*(*(double *)((long)adStack_b0 + lVar12 + 0x18),&local_118);
              local_108.y = OVar21.y;
              local_108.x = OVar21.x;
              OVar21 = ON_2dPoint::operator+(&local_168,&local_108);
              local_1e8.x._0_4_ = OVar21.x._0_4_;
              local_1e8.x._4_4_ = OVar21.x._4_4_;
              local_1e8.y._0_4_ = OVar21.y._0_4_;
              local_1e8.y._4_4_ = OVar21.y._4_4_;
              dVar15 = dVar15 + (local_1b8 + OVar21.y) * (local_1d8 - OVar21.x);
              lVar12 = lVar12 + 0x20;
              uVar19 = (undefined4)uVar16;
              uVar20 = (undefined4)((ulong)uVar16 >> 0x20);
              uVar17 = extraout_XMM0_Dc_00;
              uVar18 = extraout_XMM0_Dd_00;
            } while (lVar12 != 0x78);
            local_1e8.x._0_4_ = SUB84(local_118.x,0);
            local_1e8.x._4_4_ = (undefined4)((ulong)local_118.x >> 0x20);
            local_1e8.y._0_4_ = SUB84(local_118.y,0);
            local_1e8.y._4_4_ = (undefined4)((ulong)local_118.y >> 0x20);
            auVar5._8_4_ = local_1e8.y._0_4_;
            auVar5._0_8_ = local_118.x;
            auVar5._12_4_ = local_1e8.y._4_4_;
            dVar15 = dVar15 + (OVar21.y + auVar5._8_8_) * (OVar21.x - local_118.x);
            pOVar14 = local_1a8;
            uVar7 = local_1bc;
          }
          else if (local_1c8.m_point_type == QuadraticBezierPoint) {
            bVar6 = ON_OutlineFigurePoint::IsOffFigure(&local_1c8);
            if ((!bVar6) || (uVar11 = uVar8 + 1, uVar7 <= uVar11)) break;
            if (local_1c8.m_point_type != pOVar14[uVar11].m_point_type) break;
            bVar6 = ON_OutlineFigurePoint::IsOnFigure(pOVar14 + uVar11);
            if (!bVar6) break;
            if ((local_e8[0] == -1.23432101234321e+308) && (!NAN(local_e8[0]))) {
              lVar12 = 1;
              pdVar13 = local_e8;
              do {
                local_1b8 = (double)(int)lVar12 * 0.25;
                lVar10 = 0;
                do {
                  dVar2 = ON_EvaluateBernsteinBasis(2,(int)lVar10,local_1b8);
                  pdVar13[lVar10] = dVar2;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar12 = lVar12 + 1;
                pdVar13 = pdVar13 + 3;
              } while (lVar12 != 4);
            }
            local_148.y = (double)CONCAT44(uStack_1cc,uStack_1d0);
            local_148.x = local_1d8;
            local_138.x = (double)CONCAT44(local_1e8.x._4_4_,local_1e8.x._0_4_);
            local_138.y = (double)CONCAT44(local_1e8.y._4_4_,local_1e8.y._0_4_);
            ON_2dPoint::operator=(&local_128,&pOVar14[uVar11].m_point);
            local_1e8.x._0_4_ = (undefined4)local_1d8;
            local_1e8.x._4_4_ = local_1d8._4_4_;
            local_1e8.y._0_4_ = uStack_1d0;
            local_1e8.y._4_4_ = uStack_1cc;
            lVar12 = 0x10;
            uVar17 = uStack_1d0;
            uVar18 = uStack_1cc;
            uVar19 = uStack_1d0;
            uVar20 = uStack_1cc;
            do {
              local_1d8 = (double)CONCAT44(local_1e8.x._4_4_,local_1e8.x._0_4_);
              local_1b8 = (double)CONCAT44(local_1e8.y._4_4_,local_1e8.y._0_4_);
              uStack_1d0 = uVar17;
              uStack_1cc = uVar18;
              uStack_1b0 = uVar19;
              uStack_1ac = uVar20;
              OVar21 = ::operator*(*(double *)((long)&local_f8.x + lVar12),&local_148);
              local_178.y = OVar21.y;
              local_178.x = OVar21.x;
              OVar21 = ::operator*(*(double *)((long)local_e8 + lVar12 + -8),&local_138);
              local_188.y = OVar21.y;
              local_188.x = OVar21.x;
              OVar21 = ON_2dPoint::operator+(&local_178,&local_188);
              local_168.y = OVar21.y;
              local_168.x = OVar21.x;
              OVar21 = ::operator*(*(double *)((long)local_e8 + lVar12),&local_128);
              local_198.y = OVar21.y;
              local_198.x = OVar21.x;
              OVar21 = ON_2dPoint::operator+(&local_168,&local_198);
              local_1e8.x._0_4_ = OVar21.x._0_4_;
              local_1e8.x._4_4_ = OVar21.x._4_4_;
              local_1e8.y._0_4_ = OVar21.y._0_4_;
              local_1e8.y._4_4_ = OVar21.y._4_4_;
              dVar15 = dVar15 + (local_1b8 + OVar21.y) * (local_1d8 - OVar21.x);
              lVar12 = lVar12 + 0x18;
              uVar19 = (undefined4)uVar16;
              uVar20 = (undefined4)((ulong)uVar16 >> 0x20);
              uVar17 = extraout_XMM0_Dc;
              uVar18 = extraout_XMM0_Dd;
            } while (lVar12 != 0x58);
            local_1e8.x._0_4_ = SUB84(local_128.x,0);
            local_1e8.x._4_4_ = (undefined4)((ulong)local_128.x >> 0x20);
            local_1e8.y._0_4_ = SUB84(local_128.y,0);
            local_1e8.y._4_4_ = (undefined4)((ulong)local_128.y >> 0x20);
            auVar4._8_4_ = local_1e8.y._0_4_;
            auVar4._0_8_ = local_128.x;
            auVar4._12_4_ = local_1e8.y._4_4_;
            dVar15 = dVar15 + (OVar21.y + auVar4._8_8_) * (OVar21.x - local_128.x);
            pOVar14 = local_1a8;
            uVar7 = local_1bc;
          }
          else {
            if (local_1c8.m_point_type != LineTo) break;
            auVar3._8_4_ = local_1e8.y._0_4_;
            auVar3._0_8_ = CONCAT44(local_1e8.x._4_4_,local_1e8.x._0_4_);
            auVar3._12_4_ = local_1e8.y._4_4_;
            dVar15 = dVar15 + ((double)CONCAT44(uStack_1cc,uStack_1d0) + auVar3._8_8_) *
                              (local_1d8 - (double)CONCAT44(local_1e8.x._4_4_,local_1e8.x._0_4_));
            uVar11 = uVar8;
          }
          uVar8 = uVar11 + 1;
          uVar9 = (ulong)uVar8;
        } while (uVar8 < uVar7);
        if (uVar8 == uVar7) {
          local_1d8 = (double)CONCAT44(local_1e8.x._4_4_,local_1e8.x._0_4_);
          local_1b8 = (double)CONCAT44(local_1e8.y._4_4_,local_1e8.y._0_4_);
          ON_2dPoint::operator=(&local_1e8,(ON_2fPoint *)(local_158 + 4));
          local_1a0->m_area_estimate =
               (dVar15 + (local_1b8 + (double)CONCAT44(local_1e8.y._4_4_,local_1e8.y._0_4_)) *
                         (local_1d8 - (double)CONCAT44(local_1e8.x._4_4_,local_1e8.x._0_4_))) * 0.5;
          local_1a0->m_area_status = '\x01';
          this = local_1a0;
          goto LAB_0048da6e;
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                   ,0x479,"","Area calculation failed.");
      }
      this = local_1a0;
      if ((local_1a0->m_figure_type < 5) && ((0x13U >> (local_1a0->m_figure_type & 0x1f) & 1) != 0))
      {
        local_1a0->m_figure_type = NotPerimeter;
      }
    }
  }
LAB_0048da6e:
  return this->m_area_estimate;
}

Assistant:

double ON_OutlineFigure::AreaEstimate() const
{
  while (0 == m_area_status)
  {
    m_area_estimate = ON_DBL_QNAN;
    m_area_status = 7;

    const ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
    if (0 == figure_end_dex)
      break;

    const ON_OutlineFigurePoint* a = m_points.Array();

    const ON_OutlineFigurePoint figure_start = a[0];
    const ON_OutlineFigurePoint figure_end = a[figure_end_dex];

    if (
      ON_OutlineFigurePoint::Type::BeginFigureOpen == figure_start.m_point_type
      || ON_OutlineFigurePoint::Type::EndFigureOpen == figure_end.m_point_type
      || figure_end_dex <= 2
      )
    {
      m_area_estimate = 0.0;
      m_area_status = 1;
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
      break;
    }

    ON_2dPoint cv[4], p0, p1;

    double quad[3][3];
    double cubic[3][4];

    quad[0][0] = ON_UNSET_VALUE;
    cubic[0][0] = ON_UNSET_VALUE;
    double twice_area = 0.0;

    p1 = figure_start.m_point;
    ON__UINT32 i;
    for ( i = 1; i < figure_end_dex; i++)
    {
      const ON_OutlineFigurePoint p = a[i];
      p0 = p1;
      p1 = p.m_point;

      if (ON_OutlineFigurePoint::Type::LineTo == p.m_point_type)
      {
        twice_area += Internal_DeltaArea(p0, p1);
        continue;
      }

      if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint == p.m_point_type)
      {
        if (
          p.IsOffFigure()
          && i + 1 < figure_end_dex
          && p.m_point_type == a[i + 1].m_point_type
          &&  a[i + 1].IsOnFigure()
          )
        {
          // approximate quadratic with 4 line segments
          if (ON_UNSET_VALUE == quad[0][0])
          {
            for (int tdex = 1; tdex <= 3; tdex++)
            {
              const double t = 0.25 * tdex;
              //const double s = 1.0 - t;
              for (int cvdex = 0; cvdex < 3; cvdex++)
              {
                quad[tdex - 1][cvdex] = ON_EvaluateBernsteinBasis(2, cvdex, t);
              }
            }
          }
          cv[0] = p0;
          cv[1] = p1;
          cv[2] = a[++i].m_point;
          p1 = p0;
          for (int j = 0; j < 3; j++)
          {
            p0 = p1;
            p1 = quad[j][0] * cv[0] + quad[j][1] * cv[1] + quad[j][2] * cv[2];
            twice_area += Internal_DeltaArea(p0, p1);
          }
          p0 = p1;
          p1 = cv[2];
          twice_area += Internal_DeltaArea(p0, p1);
          continue;
        }
        // error
        break;
      }

      if (ON_OutlineFigurePoint::Type::CubicBezierPoint == p.m_point_type)
      {
        if (
          // approximate cubic with 4 line segments
          p.IsOffFigure()
          && i + 2 < figure_end_dex
          && p.m_point_type == a[i + 1].m_point_type
          && a[i + 1].IsOffFigure()
          && p.m_point_type == a[i + 2].m_point_type
          && a[i + 2].IsOnFigure()
          )
        {
          if (ON_UNSET_VALUE == cubic[0][0])
          {
            for (int tdex = 1; tdex <= 3; tdex++)
            {
              const double t = 0.25 * tdex;
              //const double s = 1.0 - t;
              for (int cvdex = 0; cvdex < 4; cvdex++)
              {
                cubic[tdex - 1][cvdex] = ON_EvaluateBernsteinBasis(3, cvdex, t);
              }
            }
          }
          cv[0] = p0;
          cv[1] = p1;
          cv[2] = a[++i].m_point;
          cv[3] = a[++i].m_point;
          p1 = p0;
          for (int j = 0; j < 3; j++)
          {
            p0 = p1;
            p1 = cubic[j][0] * cv[0] + cubic[j][1] * cv[1] + cubic[j][2] * cv[2] + cubic[j][3] * cv[3];
            twice_area += Internal_DeltaArea(p0, p1);
          }
          p0 = p1;
          p1 = cv[3];
          twice_area += Internal_DeltaArea(p0, p1);
          continue;
        }
        // error
        break;
      }

      break;
    }

    if (i != figure_end_dex)
    {
      ON_ERROR("Area calculation failed.");
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
      break; // error
    }

    p0 = p1;
    p1 = figure_start.m_point;
    twice_area += Internal_DeltaArea(p0, p1);

    m_area_estimate = 0.5*twice_area;
    m_area_status = 1;
    break;
  }

  return m_area_estimate;
}